

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

Vec_Int_t * Gia_ManFindMapping(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Wec_t *vChains)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  uVar1 = p->nObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar5 = uVar1;
  }
  pVVar6->nCap = uVar5;
  if (uVar5 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = uVar1;
  }
  else {
    __s = (int *)malloc((long)(int)uVar5 << 2);
    pVVar6->pArray = __s;
    pVVar6->nSize = uVar1;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)(int)uVar1 << 2);
      goto LAB_0067a926;
    }
  }
  __s = (int *)0x0;
LAB_0067a926:
  iVar2 = vChains->nSize;
  if (0 < (long)iVar2) {
    pVVar3 = vChains->pArray;
    uVar7 = 0;
    do {
      if (pVVar3[uVar7].nSize < 1) {
        __assert_fail("Vec_IntSize(vChain) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                      ,0x264,
                      "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      piVar4 = pVVar3[uVar7].pArray;
      lVar8 = 0;
      do {
        uVar5 = piVar4[lVar8];
        if (((int)uVar5 < 0) || (uVar9 = uVar5 * 5 + 3, vFadds->nSize <= (int)uVar9))
        goto LAB_0067a9dd;
        lVar10 = (long)vFadds->pArray[uVar9];
        if ((lVar10 < 0) || ((int)uVar1 <= vFadds->pArray[uVar9])) goto LAB_0067a9dd;
        if (__s[lVar10] != -1) {
          __assert_fail("Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3)) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                        ,0x268,
                        "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                       );
        }
        __s[lVar10] = (int)uVar7;
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar3[uVar7].nSize);
      if (vFadds->nSize <= (int)(uVar5 * 5 + 4)) {
LAB_0067a9dd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar8 = (long)vFadds->pArray[(ulong)uVar5 * 5 + 4];
      if ((lVar8 < 0) || (uVar1 <= (uint)vFadds->pArray[(ulong)uVar5 * 5 + 4])) goto LAB_0067a9dd;
      if (__s[lVar8] != -1) {
        __assert_fail("Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4)) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                      ,0x26c,
                      "Vec_Int_t *Gia_ManFindMapping(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      __s[lVar8] = (int)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(long)iVar2);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Gia_ManFindMapping( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains )
{
    Vec_Int_t * vChain;
    int i, k, iFadd = -1;
    Vec_Int_t * vMap2Chain = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_WecForEachLevel( vChains, vChain, i )
    {
        assert( Vec_IntSize(vChain) > 0 );
        Vec_IntForEachEntry( vChain, iFadd, k )
        {
            //printf( "Chain %d: setting SUM %d (obj %d)\n", i, k, Vec_IntEntry(vFadds, 5*iFadd+3) );
            assert( Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3)) == -1 );
            Vec_IntWriteEntry( vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+3), i );
        }
        //printf( "Chain %d: setting CARRY (obj %d)\n", i, Vec_IntEntry(vFadds, 5*iFadd+4) );
        assert( Vec_IntEntry(vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4)) == -1 );
        Vec_IntWriteEntry( vMap2Chain, Vec_IntEntry(vFadds, 5*iFadd+4), i );
    }
    return vMap2Chain;
}